

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::submit::render_value(submit *this,form_context *context)

{
  ostream *out;
  void *p;
  escape local_60;
  streamable local_38;
  
  out = form_context::out(context);
  std::__ostream_insert<char,std::char_traits<char>>(out,"value=\"",7);
  filters::streamable::set
            (&local_38,&(this->super_base_html_input).field_0x40,
             filters::streamable::to_stream<booster::locale::basic_message<char>>,
             filters::streamable::to_string<booster::locale::basic_message<char>>,
             (type_info *)&booster::locale::basic_message<char>::typeinfo);
  filters::escape::escape(&local_60,&local_38);
  filters::escape::operator()(&local_60,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\" ",2);
  filters::escape::~escape(&local_60);
  filters::streamable::~streamable(&local_38);
  return;
}

Assistant:

void submit::render_value(form_context &context)
{
	context.out() << "value=\"" << filters::escape(value_) << "\" ";
}